

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<Header>::Inserter::insertOne(Inserter *this,qsizetype pos,Header *t)

{
  __index_type _Var1;
  Header *pHVar2;
  qsizetype qVar3;
  Header *pHVar4;
  undefined8 uVar5;
  Data *pDVar6;
  char *pcVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  long lVar10;
  long lVar11;
  long in_FS_OFFSET;
  anon_class_8_1_a78179b7_conflict local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pHVar2 = this->begin;
  lVar11 = this->size;
  pHVar4 = pHVar2 + lVar11;
  this->end = pHVar4;
  this->last = pHVar2 + lVar11 + -1;
  this->where = pHVar2 + pos;
  lVar10 = lVar11 - pos;
  this->sourceCopyConstruct = 0;
  this->nSource = 1;
  this->move = 1 - lVar10;
  this->sourceCopyAssign = 1;
  local_40.__lhs = (_Move_ctor_base<false,_QHttpHeaders::WellKnownHeader,_QByteArray> *)pHVar4;
  if (lVar10 < 1) {
    this->sourceCopyConstruct = 1 - lVar10;
    this->move = 0;
    this->sourceCopyAssign = lVar10;
    (pHVar4->name).data.super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
    super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
    super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
    super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
    super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
    super__Variant_storage_alias<QHttpHeaders::WellKnownHeader,_QByteArray>._M_index = 0xff;
    _Var1 = (t->name).data.super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
            super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
            super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
            super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
            super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
            super__Variant_storage_alias<QHttpHeaders::WellKnownHeader,_QByteArray>._M_index;
    (pHVar4->name).data.super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
    super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
    super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
    super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
    super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
    super__Variant_storage_alias<QHttpHeaders::WellKnownHeader,_QByteArray>._M_index = _Var1;
    (*std::__detail::__variant::
      __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_std::variant<QHttpHeaders::WellKnownHeader,_QByteArray>_&&>
      ::_S_vtable._M_arr[(long)(char)_Var1 + 1]._M_data)
              (&local_40,(variant<QHttpHeaders::WellKnownHeader,_QByteArray> *)t);
    pDVar6 = (t->value).d.d;
    (t->value).d.d = (Data *)0x0;
    (pHVar4->value).d.d = pDVar6;
    pcVar7 = (t->value).d.ptr;
    (t->value).d.ptr = (char *)0x0;
    (pHVar4->value).d.ptr = pcVar7;
    qVar3 = (t->value).d.size;
    (t->value).d.size = 0;
    (pHVar4->value).d.size = qVar3;
    this->size = this->size + 1;
  }
  else {
    _Var1 = pHVar4[-1].name.data.super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
            super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
            super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
            super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
            super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
            super__Variant_storage_alias<QHttpHeaders::WellKnownHeader,_QByteArray>._M_index;
    (pHVar4->name).data.super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
    super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
    super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
    super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
    super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
    super__Variant_storage_alias<QHttpHeaders::WellKnownHeader,_QByteArray>._M_index = _Var1;
    (*std::__detail::__variant::
      __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_std::variant<QHttpHeaders::WellKnownHeader,_QByteArray>_&&>
      ::_S_vtable._M_arr[(long)(char)_Var1 + 1]._M_data)
              (&local_40,
               (variant<QHttpHeaders::WellKnownHeader,_QByteArray> *)(pHVar2 + lVar11 + -1));
    pDVar6 = pHVar4[-1].value.d.d;
    pcVar7 = pHVar4[-1].value.d.ptr;
    pHVar4[-1].value.d.d = (Data *)0x0;
    pHVar4[-1].value.d.ptr = (char *)0x0;
    (pHVar4->value).d.d = pDVar6;
    (pHVar4->value).d.ptr = pcVar7;
    qVar3 = pHVar4[-1].value.d.size;
    pHVar4[-1].value.d.size = 0;
    (pHVar4->value).d.size = qVar3;
    this->size = this->size + 1;
    if (this->move != 0) {
      lVar10 = 0;
      lVar11 = 0;
      do {
        pHVar4 = this->last;
        local_40.__lhs =
             (_Move_ctor_base<false,_QHttpHeaders::WellKnownHeader,_QByteArray> *)
             ((long)&(pHVar4->name).data.
                     super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
                     super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                     super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                     super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                     super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                     super__Variant_storage_alias<QHttpHeaders::WellKnownHeader,_QByteArray>._M_u +
             lVar10);
        (*std::__detail::__variant::
          __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:667:4)_&&,_std::variant<QHttpHeaders::WellKnownHeader,_QByteArray>_&>
          ::_S_vtable._M_arr[(long)*(char *)((long)pHVar4 + lVar10 + -0x20) + 1]._M_data)
                  ((anon_class_8_1_8991fb9c *)&local_40,
                   (variant<QHttpHeaders::WellKnownHeader,_QByteArray> *)
                   ((long)&pHVar4[-1].name.data.
                           super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
                           super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                           super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                           super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                           super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                           super__Variant_storage_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                           _M_u + lVar10));
        uVar5 = *(undefined8 *)((long)&(pHVar4->value).d.d + lVar10);
        uVar8 = *(undefined8 *)((long)&(pHVar4->value).d.ptr + lVar10);
        uVar9 = *(undefined8 *)((long)pHVar4 + lVar10 + -0x10);
        *(undefined8 *)((long)&(pHVar4->value).d.d + lVar10) =
             *(undefined8 *)((long)pHVar4 + lVar10 + -0x18);
        *(undefined8 *)((long)&(pHVar4->value).d.ptr + lVar10) = uVar9;
        *(undefined8 *)((long)pHVar4 + lVar10 + -0x18) = uVar5;
        *(undefined8 *)((long)pHVar4 + lVar10 + -0x10) = uVar8;
        uVar5 = *(undefined8 *)((long)&(pHVar4->value).d.size + lVar10);
        *(undefined8 *)((long)&(pHVar4->value).d.size + lVar10) =
             *(undefined8 *)((long)pHVar4 + lVar10 + -8);
        *(undefined8 *)((long)pHVar4 + lVar10 + -8) = uVar5;
        lVar11 = lVar11 + -1;
        lVar10 = lVar10 + -0x38;
      } while (lVar11 != this->move);
    }
    pHVar4 = this->where;
    local_40.__lhs = (_Move_ctor_base<false,_QHttpHeaders::WellKnownHeader,_QByteArray> *)pHVar4;
    (*std::__detail::__variant::
      __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:667:4)_&&,_std::variant<QHttpHeaders::WellKnownHeader,_QByteArray>_&>
      ::_S_vtable._M_arr
      [(long)(char)(t->name).data.super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
                   super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                   super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                   super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                   super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                   super__Variant_storage_alias<QHttpHeaders::WellKnownHeader,_QByteArray>._M_index
       + 1]._M_data)((anon_class_8_1_8991fb9c *)&local_40,
                     (variant<QHttpHeaders::WellKnownHeader,_QByteArray> *)t);
    pDVar6 = (pHVar4->value).d.d;
    (pHVar4->value).d.d = (t->value).d.d;
    (t->value).d.d = pDVar6;
    pcVar7 = (pHVar4->value).d.ptr;
    (pHVar4->value).d.ptr = (t->value).d.ptr;
    (t->value).d.ptr = pcVar7;
    qVar3 = (pHVar4->value).d.size;
    (pHVar4->value).d.size = (t->value).d.size;
    (t->value).d.size = qVar3;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void insertOne(qsizetype pos, T &&t)
        {
            setup(pos, 1);

            if (sourceCopyConstruct) {
                Q_ASSERT(sourceCopyConstruct == 1);
                new (end) T(std::move(t));
                ++size;
            } else {
                // create a new element at the end by move constructing one existing element
                // inside the array.
                new (end) T(std::move(*(end - 1)));
                ++size;

                // now move assign existing elements towards the end
                for (qsizetype i = 0; i != move; --i)
                    last[i] = std::move(last[i - 1]);

                // and move the new item into place
                *where = std::move(t);
            }
        }